

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O2

void run_test(uint32_t spanlen,uint32_t intvlen,double density,order_t order)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  __time_t _Var3;
  ulong uVar4;
  roaring_bitmap_t *prVar5;
  long lVar6;
  uint32_t *puVar7;
  long lVar8;
  int64_t i_1;
  char *pcVar9;
  ulong uVar10;
  uint32_t j;
  uint32_t uVar11;
  int64_t i;
  ulong uVar12;
  long lVar13;
  int64_t i_2;
  uint32_t *vals;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uStack_110;
  double local_108 [5];
  undefined8 uStack_e0;
  uint32_t *local_d0;
  uint32_t *offsets;
  timespec ts_5;
  uint32_t count;
  undefined1 auStack_48 [8];
  timespec ts;
  
  if (order == ASC) {
    pcVar9 = "ASC";
  }
  else if (order == DESC) {
    pcVar9 = "DESC";
  }
  else {
    pcVar9 = "???";
    if (order == SHUFFLE) {
      pcVar9 = "SHUFFLE";
    }
  }
  uStack_e0 = 0x10149d;
  printf("intvlen=%u density=%f order=%s\n",intvlen,pcVar9);
  uStack_e0 = 0x1014ca;
  make_data(spanlen,intvlen,density,order,&local_d0,(uint32_t *)((long)&ts_5.tv_nsec + 4));
  printf("  roaring_bitmap_add():");
  uVar4 = (ulong)ts_5.tv_nsec._4_4_;
  dVar16 = (double)uVar4;
  uVar14 = (ulong)intvlen;
  dVar17 = (double)uVar14;
  for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
    prVar5 = roaring_bitmap_create();
    clock_gettime(3,(timespec *)auStack_48);
    _Var3 = ts.tv_sec;
    auVar2 = auStack_48;
    for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
      for (uVar11 = 0; intvlen != uVar11; uVar11 = uVar11 + 1) {
        roaring_bitmap_add(prVar5,local_d0[uVar12] + uVar11);
      }
    }
    clock_gettime(3,(timespec *)auStack_48);
    lVar6 = ((long)auStack_48 - (long)auVar2) * 1000000000 + (ts.tv_sec - _Var3);
    auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar18._0_8_ = lVar6;
    auVar18._12_4_ = 0x45300000;
    local_108[lVar13] =
         (((auVar18._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar16) / dVar17;
    roaring_bitmap_free(prVar5);
  }
  array_min(local_108,5);
  printf("          %6.1f\n");
  printf("  roaring_bitmap_add_many():");
  for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
    prVar5 = roaring_bitmap_create();
    lVar6 = -((ulong)(ts_5.tv_nsec._4_4_ * intvlen) * 4 + 0xf & 0xfffffffffffffff0);
    vals = (uint32_t *)((long)local_108 + lVar6);
    puVar7 = vals;
    for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        puVar7[uVar10] = local_d0[uVar12] + (int)uVar10;
      }
      puVar7 = puVar7 + uVar14;
    }
    *(undefined8 *)((long)&uStack_110 + lVar6) = 3;
    uVar1 = *(undefined8 *)((long)&uStack_110 + lVar6);
    *(undefined8 *)((long)&uStack_110 + lVar6) = 0x101688;
    clock_gettime((clockid_t)uVar1,(timespec *)auStack_48);
    _Var3 = ts.tv_sec;
    auVar2 = auStack_48;
    uVar12 = uVar4;
    while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
      *(undefined8 *)((long)&uStack_110 + lVar6) = 0x1016b3;
      roaring_bitmap_add_many(prVar5,uVar14,vals);
      vals = vals + uVar14;
    }
    *(undefined8 *)((long)&uStack_110 + lVar6) = 3;
    uVar1 = *(undefined8 *)((long)&uStack_110 + lVar6);
    *(undefined8 *)((long)&uStack_110 + lVar6) = 0x1016c4;
    clock_gettime((clockid_t)uVar1,(timespec *)auStack_48);
    lVar8 = ((long)auStack_48 - (long)auVar2) * 1000000000 + (ts.tv_sec - _Var3);
    auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar19._0_8_ = lVar8;
    auVar19._12_4_ = 0x45300000;
    local_108[lVar13] =
         (((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar16) / dVar17;
    *(undefined8 *)((long)&uStack_110 + lVar6) = 0x101726;
    roaring_bitmap_free(prVar5);
  }
  array_min(local_108,5);
  printf("     %6.1f\n");
  printf("  roaring_bitmap_add_bulk():");
  for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
    prVar5 = roaring_bitmap_create();
    clock_gettime(3,(timespec *)auStack_48);
    _Var3 = ts.tv_sec;
    auVar2 = auStack_48;
    auStack_48 = (undefined1  [8])0x0;
    ts.tv_sec = 0;
    for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
      for (uVar11 = 0; intvlen != uVar11; uVar11 = uVar11 + 1) {
        roaring_bitmap_add_bulk
                  (prVar5,(roaring_bulk_context_t *)auStack_48,local_d0[uVar14] + uVar11);
      }
    }
    clock_gettime(3,(timespec *)&offsets);
    lVar6 = ((long)offsets - (long)auVar2) * 1000000000 + (ts_5.tv_sec - _Var3);
    auVar20._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar20._0_8_ = lVar6;
    auVar20._12_4_ = 0x45300000;
    local_108[lVar13] =
         (((auVar20._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar16) / dVar17;
    roaring_bitmap_free(prVar5);
  }
  array_min(local_108,5);
  printf("     %6.1f\n");
  printf("  roaring_bitmap_add_range():");
  for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
    prVar5 = roaring_bitmap_create();
    clock_gettime(3,(timespec *)auStack_48);
    _Var3 = ts.tv_sec;
    auVar2 = auStack_48;
    for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
      roaring_bitmap_add_range(prVar5,(ulong)local_d0[uVar14],(ulong)(local_d0[uVar14] + intvlen));
    }
    clock_gettime(3,(timespec *)auStack_48);
    lVar6 = ((long)auStack_48 - (long)auVar2) * 1000000000 + (ts.tv_sec - _Var3);
    auVar21._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar21._0_8_ = lVar6;
    auVar21._12_4_ = 0x45300000;
    local_108[lVar13] =
         (((auVar21._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar16) / dVar17;
    roaring_bitmap_free(prVar5);
  }
  array_min(local_108,5);
  printf("    %6.1f\n");
  printf("  roaring_bitmap_remove():");
  for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
    prVar5 = roaring_bitmap_create();
    roaring_bitmap_add_range(prVar5,0,(ulong)spanlen);
    clock_gettime(3,(timespec *)auStack_48);
    _Var3 = ts.tv_sec;
    auVar2 = auStack_48;
    for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
      for (uVar11 = 0; intvlen != uVar11; uVar11 = uVar11 + 1) {
        roaring_bitmap_remove(prVar5,local_d0[uVar14] + uVar11);
      }
    }
    clock_gettime(3,(timespec *)auStack_48);
    lVar6 = ((long)auStack_48 - (long)auVar2) * 1000000000 + (ts.tv_sec - _Var3);
    auVar22._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar22._0_8_ = lVar6;
    auVar22._12_4_ = 0x45300000;
    local_108[lVar13] =
         (((auVar22._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar16) / dVar17;
    roaring_bitmap_free(prVar5);
  }
  array_min(local_108,5);
  printf("       %6.1f\n");
  printf("  roaring_bitmap_remove_range():");
  for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
    prVar5 = roaring_bitmap_create();
    roaring_bitmap_add_range(prVar5,0,(ulong)spanlen);
    clock_gettime(3,(timespec *)auStack_48);
    _Var3 = ts.tv_sec;
    auVar2 = auStack_48;
    for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
      roaring_bitmap_remove_range
                (prVar5,(ulong)local_d0[uVar14],(ulong)(local_d0[uVar14] + intvlen));
    }
    clock_gettime(3,(timespec *)auStack_48);
    lVar6 = ((long)auStack_48 - (long)auVar2) * 1000000000 + (ts.tv_sec - _Var3);
    auVar23._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar23._0_8_ = lVar6;
    auVar23._12_4_ = 0x45300000;
    local_108[lVar13] =
         (((auVar23._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar16) / dVar17;
    roaring_bitmap_free(prVar5);
  }
  array_min(local_108,5);
  printf(" %6.1f\n");
  free(local_d0);
  return;
}

Assistant:

void run_test(uint32_t spanlen, uint32_t intvlen, double density,
              order_t order) {
    printf("intvlen=%u density=%f order=%s\n", intvlen, density,
           (order == ASC
                ? "ASC"
                : (order == DESC ? "DESC"
                                 : (order == SHUFFLE ? "SHUFFLE" : "???"))));

    uint32_t *offsets;
    uint32_t count;
    make_data(spanlen, intvlen, density, order, &offsets, &count);
    const int num_passes = 5;
    uint64_t cycles_start, cycles_final;
    double results[num_passes];

    printf("  roaring_bitmap_add():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("          %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_many():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        uint32_t values[intvlen * count];
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                values[i * intvlen + j] = offsets[i] + j;
            }
        }
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_many(r, intvlen, values + (i * intvlen));
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_bulk():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        roaring_bulk_context_t context = {0, 0, 0, 0};
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add_bulk(r, &context, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("    %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_remove(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("       %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_remove_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf(" %6.1f\n", array_min(results, num_passes));

    free(offsets);
}